

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<Fad<double>,_3>::Resize
          (TPZManVector<Fad<double>,_3> *this,int64_t newsize,Fad<double> *object)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  Fad<double> *pFVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Fad<double> *pFVar6;
  long in_RSI;
  TPZManVector<Fad<double>,_3> *in_RDI;
  ulong uVar7;
  Fad<double> *newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  Fad<double> *in_stack_ffffffffffffff08;
  Fad<double> *in_stack_ffffffffffffff10;
  Fad<double> *this_01;
  Fad<double> *in_stack_ffffffffffffff20;
  double dVar8;
  Fad<double> *local_a8;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<Fad<double>_>).fNElements) {
    if ((in_RDI->super_TPZVec<Fad<double>_>).fNAlloc < in_RSI) {
      if (in_RSI < 4) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<Fad<double>_>).fNElements;
            local_28 = local_28 + 1) {
          Fad<double>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          Fad<double>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<Fad<double>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar6 = (in_RDI->super_TPZVec<Fad<double>_>).fStore, pFVar6 != (Fad<double> *)0x0)) {
          dVar8 = pFVar6[-1].defaultVal;
          for (pFVar2 = pFVar6 + (long)dVar8; pFVar6 != pFVar2; pFVar2 = pFVar2 + -1) {
            Fad<double>::~Fad(in_stack_ffffffffffffff10);
          }
          operator_delete__(&pFVar6[-1].defaultVal,(long)dVar8 * 0x20 + 8);
        }
        (in_RDI->super_TPZVec<Fad<double>_>).fStore = in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<double>_>).fNAlloc = 3;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x20),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        pFVar6 = (Fad<double> *)(puVar5 + 1);
        if (uVar3 != 0) {
          local_a8 = pFVar6;
          do {
            Fad<double>::Fad(in_stack_ffffffffffffff20);
            local_a8 = local_a8 + 1;
          } while (local_a8 != pFVar6 + uVar3);
        }
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<Fad<double>_>).fNElements;
            local_30 = local_30 + 1) {
          Fad<double>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          Fad<double>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        }
        if (((in_RDI->super_TPZVec<Fad<double>_>).fStore != in_RDI->fExtAlloc) &&
           (pFVar2 = (in_RDI->super_TPZVec<Fad<double>_>).fStore, pFVar2 != (Fad<double> *)0x0)) {
          dVar8 = pFVar2[-1].defaultVal;
          this_01 = pFVar2 + (long)dVar8;
          while (pFVar2 != this_01) {
            this_01 = this_01 + -1;
            Fad<double>::~Fad(this_01);
          }
          operator_delete__(&pFVar2[-1].defaultVal,(long)dVar8 * 0x20 + 8);
        }
        (in_RDI->super_TPZVec<Fad<double>_>).fStore = pFVar6;
        (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<Fad<double>_>).fNAlloc = uVar3;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<Fad<double>_>).fNElements; local_20 < in_RSI;
          local_20 = local_20 + 1) {
        Fad<double>::operator=(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      (in_RDI->super_TPZVec<Fad<double>_>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}